

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_api_suite::test_size(void)

{
  undefined4 local_8c;
  size_type local_88;
  undefined4 local_7c;
  size_type local_78;
  undefined4 local_6c;
  size_type local_68;
  undefined4 local_5c;
  size_type local_58;
  undefined4 local_4c;
  size_type local_48;
  undefined4 local_3c;
  size_type local_38 [2];
  undefined1 local_28 [8];
  moment<double,_4> filter;
  
  trial::online::interim::basic_moment<double,_4UL,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_28);
  local_38[0] = trial::online::interim::detail::
                basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::size
                          ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>
                            *)local_28);
  local_3c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x45,"void mean_api_suite::test_size()",local_38,&local_3c);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             1.0);
  local_48 = trial::online::interim::detail::
             basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::size
                       ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *
                        )local_28);
  local_4c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x47,"void mean_api_suite::test_size()",&local_48,&local_4c);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             2.0);
  local_58 = trial::online::interim::detail::
             basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::size
                       ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *
                        )local_28);
  local_5c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x49,"void mean_api_suite::test_size()",&local_58,&local_5c);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             3.0);
  local_68 = trial::online::interim::detail::
             basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::size
                       ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *
                        )local_28);
  local_6c = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x4b,"void mean_api_suite::test_size()",&local_68,&local_6c);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             4.0);
  local_78 = trial::online::interim::detail::
             basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::size
                       ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *
                        )local_28);
  local_7c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x4d,"void mean_api_suite::test_size()",&local_78,&local_7c);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             5.0);
  local_88 = trial::online::interim::detail::
             basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::size
                       ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *
                        )local_28);
  local_8c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x4f,"void mean_api_suite::test_size()",&local_88,&local_8c);
  return;
}

Assistant:

void test_size()
{
    interim::moment<double, 4> filter;
    TRIAL_TEST_EQ(filter.size(), 0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 1);
    filter.push(2.0);
    TRIAL_TEST_EQ(filter.size(), 2);
    filter.push(3.0);
    TRIAL_TEST_EQ(filter.size(), 3);
    filter.push(4.0);
    TRIAL_TEST_EQ(filter.size(), 4);
    filter.push(5.0);
    TRIAL_TEST_EQ(filter.size(), 4);
}